

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void Cmd_listsoundchannels(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *pcVar1;
  undefined1 local_38 [8];
  FVector3 chanorigin;
  int count;
  FSoundChan *chan;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  chanorigin.Y = 0.0;
  for (stack0xffffffffffffffd8 = Channels; stack0xffffffffffffffd8 != (FSoundChan *)0x0;
      unique0x00012000 = stack0xffffffffffffffd8->NextChan) {
    if ((stack0xffffffffffffffd8->ChanFlags & 2U) == 0) {
      TVector3<float>::TVector3((TVector3<float> *)local_38);
      CalcPosVel(stack0xffffffffffffffd8,(FVector3 *)local_38,(FVector3 *)0x0);
      pcVar1 = FSoundID::operator_cast_to_char_(&stack0xffffffffffffffd8->SoundID);
      Printf("%s at (%1.5f, %1.5f, %1.5f)\n",(double)(float)local_38._0_4_,
             (double)(float)local_38._4_4_,(double)chanorigin.X,pcVar1);
      chanorigin.Y = (float)((int)chanorigin.Y + 1);
    }
  }
  Printf("%d sounds playing\n",(ulong)(uint)chanorigin.Y);
  return;
}

Assistant:

CCMD(listsoundchannels)
{	
	FSoundChan *chan;
	int count = 0;
	for (chan = Channels; chan != NULL; chan = chan->NextChan)
	{
		if (!(chan->ChanFlags & CHAN_EVICTED))
		{
			FVector3 chanorigin;

			CalcPosVel(chan, &chanorigin, NULL);

			Printf("%s at (%1.5f, %1.5f, %1.5f)\n", (const char*)chan->SoundID, chanorigin.X, chanorigin.Y, chanorigin.Z);
			count++;
		}
	}
	Printf("%d sounds playing\n", count);
}